

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  bool bVar1;
  undefined1 local_98 [8];
  file_descriptor_source source;
  path local_68;
  undefined4 local_48;
  undefined1 local_38 [8];
  path p;
  char **param_1_local;
  int param_0_local;
  
  p.m_pathname.field_2._8_8_ = param_2;
  boost::filesystem::path::path((path *)local_38,"/my/path");
  bVar1 = boost::filesystem::exists((path *)local_38);
  if (bVar1) {
    local_48 = 1;
  }
  else {
    boost::filesystem::current_path();
    boost::filesystem::absolute
              (&local_68,(path *)local_38,(path *)&source.super_file_descriptor.pimpl_.pn);
    boost::filesystem::path::operator=((path *)local_38,&local_68);
    boost::filesystem::path::~path(&local_68);
    boost::filesystem::path::~path((path *)&source.super_file_descriptor.pimpl_.pn);
    boost::iostreams::file_descriptor_source::file_descriptor_source
              ((file_descriptor_source *)local_98);
    local_48 = 1;
    boost::iostreams::file_descriptor_source::~file_descriptor_source
              ((file_descriptor_source *)local_98);
  }
  param_1_local._4_4_ = (uint)bVar1;
  boost::filesystem::path::~path((path *)local_38);
  return param_1_local._4_4_;
}

Assistant:

int main(int, char**)
{
  if (false)
    return 0;

  fs::path p("/my/path");
  if (fs::exists(p))
    return 1;

  p = fs::absolute(p);

  boost::iostreams::file_descriptor_source source;
  return 0;
}